

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::TabulationRecord::TabulationRecord
          (TabulationRecord *this,double C1,double C2,long L1,long L2,
          vector<long,_std::allocator<long>_> *boundaries,
          vector<long,_std::allocator<long>_> *interpolants,
          vector<double,_std::allocator<double>_> *x,vector<double,_std::allocator<double>_> *y)

{
  pointer pdVar1;
  
  record::InterpolationBase::InterpolationBase
            (&this->super_InterpolationBase,C1,C2,L1,L2,boundaries,interpolants);
  pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->xValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (this->xValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar1;
  (this->xValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar1 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->yValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (this->yValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar1;
  (this->yValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  verifyXValuesAreSorted(&this->xValues);
  verifyVectorSizes(&this->xValues,&this->yValues);
  verifyNP(*(uint *)((this->super_InterpolationBase).boundaryIndices.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_finish + -1),
           (uint)((ulong)((long)(this->xValues).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->xValues).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3));
  return;
}

Assistant:

TabulationRecord ( double C1, double C2, long L1, long L2,
                    std::vector< long >&& boundaries,
                    std::vector< long >&& interpolants,
                    std::vector< double >&& x,
                    std::vector< double >&& y )
  try : InterpolationBase( C1, C2, L1, L2, std::move( boundaries ),
                           std::move( interpolants ) ),
                           xValues( std::move( x ) ),
                           yValues( std::move( y ) ) {

    verifyXValuesAreSorted( this->xValues );
    verifyVectorSizes( this->xValues, this->yValues );
    verifyNP( this->boundaries().back(), this->xValues.size() );
  }
  catch ( std::exception& e ) {
    Log::info( "Error encountered while constructing TAB1 record" );
    throw e;
  }